

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::Tensor::ByteSizeLong(Tensor *this)

{
  int iVar1;
  long lVar2;
  ulong *puVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  int index;
  
  iVar1 = (this->dimvalue_).current_size_;
  index = 0;
  if (iVar1 < 1) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      puVar3 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->dimvalue_,index);
      lVar2 = 0x3f;
      if ((*puVar3 | 1) != 0) {
        for (; (*puVar3 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar6 = (uint)lVar7;
  if (lVar7 == 0) {
    uVar4 = 0;
  }
  else if ((int)uVar6 < 0) {
    uVar4 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar6 | 1) != 0) {
      for (; (uVar6 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar4 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  this->_dimvalue_cached_byte_size_ = uVar6;
  sVar5 = uVar4 + lVar7;
  if (this->rank_ != 0) {
    uVar6 = this->rank_ | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar5 = sVar5 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t Tensor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Tensor)
  size_t total_size = 0;

  // repeated int64 dimValue = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->dimvalue_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _dimvalue_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // uint32 rank = 1;
  if (this->rank() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->rank());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}